

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

RgbaChannels Imf_2_5::anon_unknown_22::rgbaChannels(ChannelList *ch,string *channelNamePrefix)

{
  Channel *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ChannelList *in_RDI;
  int i;
  string *in_stack_fffffffffffffeb8;
  ChannelList *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffee0;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [36];
  RgbaChannels local_14;
  ChannelList *local_8;
  
  local_14 = 0;
  local_8 = in_RDI;
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  pCVar1 = ChannelList::findChannel(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_38);
  if (pCVar1 != (Channel *)0x0) {
    local_14 = local_14 | WRITE_R;
  }
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  pCVar1 = ChannelList::findChannel(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_68);
  if (pCVar1 != (Channel *)0x0) {
    local_14 = local_14 | WRITE_G;
  }
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  pCVar1 = ChannelList::findChannel(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_88);
  if (pCVar1 != (Channel *)0x0) {
    local_14 = local_14 | WRITE_B;
  }
  __rhs = local_a8;
  std::operator+(in_stack_fffffffffffffee8,(char *)__rhs);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ChannelList::findChannel(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_a8);
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_14 = local_14 | WRITE_A;
  }
  std::operator+(__lhs,(char *)__rhs);
  pCVar1 = ChannelList::findChannel(local_8,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_c8);
  if (pCVar1 != (Channel *)0x0) {
    local_14 = local_14 | WRITE_Y;
  }
  return local_14;
}

Assistant:

RgbaChannels
rgbaChannels (const ChannelList &ch, const string &channelNamePrefix = "")
{
    int i = 0;

    if (ch.findChannel (channelNamePrefix + "R"))
	i |= WRITE_R;

    if (ch.findChannel (channelNamePrefix + "G"))
	i |= WRITE_G;
    
    if (ch.findChannel (channelNamePrefix + "B"))
	i |= WRITE_B;

    if (ch.findChannel (channelNamePrefix + "A"))
	i |= WRITE_A;

    if (ch.findChannel (channelNamePrefix + "Y"))
	i |= WRITE_Y;

    return RgbaChannels (i);
}